

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteColumnSizes
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *this)

{
  int iVar1;
  FeederType *this_00;
  NLHeader *pNVar2;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *in_RDI;
  ColSizeWriter csw_1;
  ColSizeWriter csw;
  ColSizeWriter local_48;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>
  *in_stack_ffffffffffffffd8;
  NLW2_NLFeeder_C_Impl *in_stack_ffffffffffffffe0;
  
  this_00 = Feeder(in_RDI);
  iVar1 = NLW2_NLFeeder_C_Impl::WantColumnSizes(this_00);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      pNVar2 = Hdr(in_RDI);
      iVar1 = (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      pNVar2 = Hdr(in_RDI);
      TextFormatter::apr(&in_RDI->super_FormatterType,&in_RDI->nm,
                         "k%d\t#intermediate Jacobian column lengths (cumulative)\n",
                         (ulong)((iVar1 + (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.
                                          num_rand_vars) - 1));
      ColSizeWriter::ColSizeWriter((ColSizeWriter *)&stack0xffffffffffffffd8,in_RDI,1);
      Feeder(in_RDI);
      NLW2_NLFeeder_C_Impl::
      FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::ColSizeWriter>
                (in_stack_ffffffffffffffe0,(ColSizeWriter *)in_stack_ffffffffffffffd8);
    }
    else if (iVar1 == 2) {
      pNVar2 = Hdr(in_RDI);
      iVar1 = (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      pNVar2 = Hdr(in_RDI);
      TextFormatter::apr(&in_RDI->super_FormatterType,&in_RDI->nm,
                         "K%d\t#intermediate Jacobian column lengths\n",
                         (ulong)((iVar1 + (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.
                                          num_rand_vars) - 1));
      ColSizeWriter::ColSizeWriter(&local_48,in_RDI,2);
      Feeder(in_RDI);
      NLW2_NLFeeder_C_Impl::
      FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::ColSizeWriter>
                (in_stack_ffffffffffffffe0,(ColSizeWriter *)in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteColumnSizes() {
  switch(Feeder().WantColumnSizes()) {
  case 1:
    apr(nm,
		#ifdef NL_LIB2_ORIG_HDR
				"k%d\t#intermediate Jacobian column lengths\n",
		#else
				"k%d\t#intermediate Jacobian column lengths (cumulative)\n",
		#endif
        Hdr().num_vars + Hdr().num_rand_vars - 1);
  {
    ColSizeWriter csw(*this, 1);
    Feeder().FeedColumnSizes(csw);
    assert(Hdr().num_vars + Hdr().num_rand_vars - 1
           == csw.GetNWritten());
  }
    break;
  case 2:
    apr(nm, "K%d\t#intermediate Jacobian column lengths\n",
        Hdr().num_vars + Hdr().num_rand_vars - 1);
  {
    ColSizeWriter csw(*this, 2);
    Feeder().FeedColumnSizes(csw);
    assert(Hdr().num_vars + Hdr().num_rand_vars - 1
           == csw.GetNWritten());
  }
    break;
  case 0:
    break;            // SKIP
  default:
    assert(0 && "why am I here?");
  }
}